

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *pFanin,Bac_Ntk_t *p,int iTerm)

{
  Bac_Man_t *pBVar1;
  uint uVar2;
  int iVar3;
  Abc_NtkFunc_t AVar4;
  ulong uVar5;
  
  if (pFanin == (Abc_Obj_t *)0x0) {
LAB_008b3c55:
    pBVar1 = p->pDesign;
    if (pFanin == (Abc_Obj_t *)0x0) {
      uVar5 = 0;
    }
    else {
      iVar3 = Abc_NodeIsConst1(pFanin);
      uVar5 = (ulong)(iVar3 != 0);
    }
    iVar3 = pBVar1->ElemGates[uVar5];
  }
  else {
    uVar2 = *(uint *)&pFanin->field_0x14 & 0xf;
    if (((uVar2 == 7) && (iVar3 = (pFanin->vFanins).nSize, 0 < iVar3)) &&
       ((iVar3 != 1 ||
        ((pFanin->pNtk->ntkFunc != ABC_FUNC_MAP || ((pFanin->field_5).pData != (void *)0x0)))))) {
      iVar3 = (pFanin->field_6).iTemp;
      goto LAB_008b3c99;
    }
    if (((uVar2 != 2) &&
        (((AVar4 = pFanin->pNtk->ntkFunc ^ ABC_FUNC_MAP, uVar2 != 7 || AVar4 != ABC_FUNC_NONE ||
          ((pFanin->vFanins).nSize != 1)) || ((pFanin->field_5).pData != (void *)0x0)))) &&
       (((uVar2 != 7 || (iVar3 = (pFanin->vFanins).nSize, iVar3 < 1)) ||
        ((AVar4 == ABC_FUNC_NONE && iVar3 == 1 && ((pFanin->field_5).pData == (void *)0x0)))))) {
      iVar3 = Abc_NodeIsConst0(pFanin);
      if (iVar3 == 0) {
        iVar3 = Abc_NodeIsConst1(pFanin);
        if (iVar3 == 0) {
          __assert_fail("!pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                        ,0x1e4,"void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *, Bac_Ntk_t *, int)");
        }
      }
      goto LAB_008b3c55;
    }
    Bac_ObjAlloc(p,BAC_OBJ_BI,(pFanin->field_6).iTemp);
    iVar3 = p->pDesign->ElemGates[2];
  }
  Bac_ObjAlloc(p,BAC_BOX_GATE,iVar3);
  iVar3 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
LAB_008b3c99:
  Bac_ObjSetFanin(p,iTerm,iVar3);
  return;
}

Assistant:

void Bac_NtkCreateOrConnectFanin( Abc_Obj_t * pFanin, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pFanin && Abc_NodeIsSeriousGate(pFanin) )//&& Bac_ObjName(p, pFanin->iTemp) == -1 ) // gate without name
    {
        iObj = pFanin->iTemp;
    }
    else if ( pFanin && (Abc_ObjIsPi(pFanin) || Abc_ObjIsBarBuf(pFanin) || Abc_NodeIsSeriousGate(pFanin)) ) // PI/BO or gate with name
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, pFanin->iTemp );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[2] ); // buffer
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    else
    {
        assert( !pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin) );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[(pFanin && Abc_NodeIsConst1(pFanin))] ); // const 0/1
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    Bac_ObjSetFanin( p, iTerm, iObj );
}